

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

bool __thiscall
pstore::command_line::opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_>::value
          (opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *this,string *v)

{
  uint *puVar1;
  maybe<unsigned_int,_void> m;
  maybe<unsigned_int,_void> local_20;
  
  parser<unsigned_int,_void>::operator()(&local_20,&this->parser_,v);
  if (local_20.valid_ == true) {
    puVar1 = maybe<unsigned_int,void>::value_impl<pstore::maybe<unsigned_int,void>&,unsigned_int>
                       (&local_20);
    this->value_ = *puVar1;
  }
  return local_20.valid_;
}

Assistant:

bool opt<T, Parser>::value (std::string const & v) {
            if (auto m = parser_ (v)) {
                value_ = m.value ();
                return true;
            }
            return false;
        }